

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tokenizer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::io::(anonymous_namespace)::TokenizerTest_Whitespace_DD::
DoSingleCase<google::protobuf::io::(anonymous_namespace)::SimpleTokenCase,int>
          (TokenizerTest_Whitespace_DD *this,SimpleTokenCase *kWhitespaceTokenCases_case,
          int *kBlockSizes_case)

{
  bool bVar1;
  int iVar2;
  void *pvVar3;
  char *pcVar4;
  Token *pTVar5;
  char *in_R9;
  string local_380;
  AssertHelper local_360;
  Message local_358;
  bool local_349;
  undefined1 local_348 [8];
  AssertionResult gtest_ar__2;
  Message local_330;
  undefined1 local_328 [8];
  AssertionResult gtest_ar_1;
  Message local_310;
  undefined1 local_308 [8];
  AssertionResult gtest_ar;
  string local_2f0;
  AssertHelper local_2d0;
  Message local_2c8;
  bool local_2b9;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar__1;
  Tokenizer tokenizer_1;
  TestErrorCollector error_collector_1;
  TestInputStream input_1;
  AssertHelper local_170;
  Message local_168;
  bool local_159;
  undefined1 local_158 [8];
  AssertionResult gtest_ar_;
  Tokenizer tokenizer;
  undefined1 local_78 [8];
  TestErrorCollector error_collector;
  TestInputStream input;
  int *kBlockSizes_case_local;
  SimpleTokenCase *kWhitespaceTokenCases_case_local;
  TokenizerTest_Whitespace_DD *this_local;
  
  pvVar3 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  io::anon_unknown_0::TestInputStream::TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8),pvVar3,iVar2,
             *kBlockSizes_case);
  io::anon_unknown_0::TestErrorCollector::TestErrorCollector((TestErrorCollector *)local_78);
  Tokenizer::Tokenizer
            ((Tokenizer *)&gtest_ar_.message_,
             (ZeroCopyInputStream *)((long)&error_collector.text_.field_2 + 8),
             (ErrorCollector *)local_78);
  bVar1 = Tokenizer::Next((Tokenizer *)&gtest_ar_.message_);
  local_159 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_158,&local_159,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_158);
  if (!bVar1) {
    testing::Message::Message(&local_168);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&input_1.counter_,(internal *)local_158,
               (AssertionResult *)"tokenizer.Next()","true","false",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_170,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x13d,pcVar4);
    testing::internal::AssertHelper::operator=(&local_170,&local_168);
    testing::internal::AssertHelper::~AssertHelper(&local_170);
    std::__cxx11::string::~string((string *)&input_1.counter_);
    testing::Message::~Message(&local_168);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_158);
  Tokenizer::~Tokenizer((Tokenizer *)&gtest_ar_.message_);
  io::anon_unknown_0::TestErrorCollector::~TestErrorCollector((TestErrorCollector *)local_78);
  io::anon_unknown_0::TestInputStream::~TestInputStream
            ((TestInputStream *)((long)&error_collector.text_.field_2 + 8));
  pvVar3 = (void *)std::__cxx11::string::data();
  iVar2 = std::__cxx11::string::size();
  io::anon_unknown_0::TestInputStream::TestInputStream
            ((TestInputStream *)((long)&error_collector_1.text_.field_2 + 8),pvVar3,iVar2,
             *kBlockSizes_case);
  io::anon_unknown_0::TestErrorCollector::TestErrorCollector
            ((TestErrorCollector *)&tokenizer_1.comment_style_);
  Tokenizer::Tokenizer
            ((Tokenizer *)&gtest_ar__1.message_,
             (ZeroCopyInputStream *)((long)&error_collector_1.text_.field_2 + 8),
             (ErrorCollector *)&tokenizer_1.comment_style_);
  Tokenizer::set_report_whitespace((Tokenizer *)&gtest_ar__1.message_,true);
  Tokenizer::set_report_newlines((Tokenizer *)&gtest_ar__1.message_,true);
  local_2b9 = Tokenizer::Next((Tokenizer *)&gtest_ar__1.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_2b8,&local_2b9,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar1) {
    testing::Message::Message(&local_2c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_2f0,(internal *)local_2b8,(AssertionResult *)"tokenizer.Next()","false","true"
               ,in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_2d0,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
               ,0x148,pcVar4);
    testing::internal::AssertHelper::operator=(&local_2d0,&local_2c8);
    testing::internal::AssertHelper::~AssertHelper(&local_2d0);
    std::__cxx11::string::~string((string *)&local_2f0);
    testing::Message::~Message(&local_2c8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    pTVar5 = Tokenizer::current((Tokenizer *)&gtest_ar__1.message_);
    testing::internal::EqHelper::
    Compare<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
              ((EqHelper *)local_308,"tokenizer.current().text","kWhitespaceTokenCases_case.input",
               &pTVar5->text,&kWhitespaceTokenCases_case->input);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_308);
    if (!bVar1) {
      testing::Message::Message(&local_310);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_308);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x149,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_310);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
      testing::Message::~Message(&local_310);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_308);
    pTVar5 = Tokenizer::current((Tokenizer *)&gtest_ar__1.message_);
    testing::internal::EqHelper::
    Compare<google::protobuf::io::Tokenizer::TokenType,_google::protobuf::io::Tokenizer::TokenType,_nullptr>
              ((EqHelper *)local_328,"tokenizer.current().type","kWhitespaceTokenCases_case.type",
               &pTVar5->type,&kWhitespaceTokenCases_case->type);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_328);
    if (!bVar1) {
      testing::Message::Message(&local_330);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_328);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__2.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x14a,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__2.message_,&local_330);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_330);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_328);
    bVar1 = Tokenizer::Next((Tokenizer *)&gtest_ar__1.message_);
    local_349 = (bool)(~bVar1 & 1);
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_348,&local_349,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar1) {
      testing::Message::Message(&local_358);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_380,(internal *)local_348,(AssertionResult *)"tokenizer.Next()","true",
                 "false",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_360,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/tokenizer_unittest.cc"
                 ,0x14c,pcVar4);
      testing::internal::AssertHelper::operator=(&local_360,&local_358);
      testing::internal::AssertHelper::~AssertHelper(&local_360);
      std::__cxx11::string::~string((string *)&local_380);
      testing::Message::~Message(&local_358);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  Tokenizer::~Tokenizer((Tokenizer *)&gtest_ar__1.message_);
  io::anon_unknown_0::TestErrorCollector::~TestErrorCollector
            ((TestErrorCollector *)&tokenizer_1.comment_style_);
  io::anon_unknown_0::TestInputStream::~TestInputStream
            ((TestInputStream *)((long)&error_collector_1.text_.field_2 + 8));
  return;
}

Assistant:

TEST_2D(TokenizerTest, Whitespace, kWhitespaceTokenCases, kBlockSizes) {
  {
    TestInputStream input(kWhitespaceTokenCases_case.input.data(),
                          kWhitespaceTokenCases_case.input.size(),
                          kBlockSizes_case);
    TestErrorCollector error_collector;
    Tokenizer tokenizer(&input, &error_collector);

    EXPECT_FALSE(tokenizer.Next());
  }
  {
    TestInputStream input(kWhitespaceTokenCases_case.input.data(),
                          kWhitespaceTokenCases_case.input.size(),
                          kBlockSizes_case);
    TestErrorCollector error_collector;
    Tokenizer tokenizer(&input, &error_collector);
    tokenizer.set_report_whitespace(true);
    tokenizer.set_report_newlines(true);

    ASSERT_TRUE(tokenizer.Next());
    EXPECT_EQ(tokenizer.current().text, kWhitespaceTokenCases_case.input);
    EXPECT_EQ(tokenizer.current().type, kWhitespaceTokenCases_case.type);

    EXPECT_FALSE(tokenizer.Next());
  }
}